

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

vector<double> * __thiscall
mat_lib::vector<double>::operator-=
          (vector<double> *__return_storage_ptr__,vector<double> *this,vector<double> *rhs)

{
  size_t sVar1;
  size_t sVar2;
  logic_error *this_00;
  reference pvVar3;
  element_t eVar4;
  int local_30;
  int i;
  vector<double> *rhs_local;
  vector<double> *this_local;
  
  sVar1 = size(this);
  sVar2 = size(rhs);
  if (sVar1 != sVar2) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"bad subtract operations");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_30 = 0;
  while( true ) {
    sVar1 = size(rhs);
    if (sVar1 <= (ulong)(long)local_30) break;
    eVar4 = operator[](rhs,(long)local_30);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->container__,(long)local_30);
    *pvVar3 = *pvVar3 - eVar4;
    local_30 = local_30 + 1;
  }
  vector(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

vector operator-=(const vector &rhs){
          if(this->size() != rhs.size()) throw logic_error("bad subtract operations");

          for (int i = 0; i < rhs.size(); ++i) {
              container__[i] -= rhs[i];
          }

          return *this;
      }